

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

int SSL_process_quic_post_handshake(SSL *ssl)

{
  SSL3_STATE *pSVar1;
  SSL_HANDSHAKE *pSVar2;
  bool bVar3;
  int iVar4;
  ERR_SAVE_STATE *__p;
  SSLMessage msg;
  SSLMessage local_40;
  
  ssl->s3->rwstate = 0;
  ERR_clear_error();
  ERR_clear_system_error();
  if (ssl->quic_method != (SSL_QUIC_METHOD *)0x0) {
    pSVar1 = ssl->s3;
    pSVar2 = (pSVar1->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
    if ((pSVar2 == (SSL_HANDSHAKE *)0x0) || ((pSVar2->field_0x6c8 & 8) != 0)) {
      if (pSVar1->read_shutdown == ssl_shutdown_error) {
        ERR_restore_state((pSVar1->read_error)._M_t.
                          super___uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl);
      }
      else {
        bVar3 = (*ssl->method->get_message)(ssl,&local_40);
        if (!bVar3) {
          return 1;
        }
        while (iVar4 = ssl_do_post_handshake(ssl,&local_40), iVar4 != 0) {
          (*ssl->method->next_message)(ssl);
          bVar3 = (*ssl->method->get_message)(ssl,&local_40);
          if (!bVar3) {
            return 1;
          }
        }
        pSVar1 = ssl->s3;
        pSVar1->read_shutdown = ssl_shutdown_error;
        __p = ERR_save_state();
        std::__uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter> *)
                   &pSVar1->read_error,__p);
      }
      return 0;
    }
  }
  ERR_put_error(0x10,0,0x42,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,0x326);
  return 0;
}

Assistant:

int SSL_process_quic_post_handshake(SSL *ssl) {
  ssl_reset_error_state(ssl);

  if (!SSL_is_quic(ssl) || SSL_in_init(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  // Replay post-handshake message errors.
  if (!check_read_error(ssl)) {
    return 0;
  }

  // Process any buffered post-handshake messages.
  SSLMessage msg;
  while (ssl->method->get_message(ssl, &msg)) {
    // Handle the post-handshake message and try again.
    if (!ssl_do_post_handshake(ssl, msg)) {
      ssl_set_read_error(ssl);
      return 0;
    }
    ssl->method->next_message(ssl);
  }

  return 1;
}